

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

int xlsxioread_sheet_next_cell_float(xlsxioreadersheet sheethandle,double *pvalue)

{
  XML_Char *__nptr;
  double dVar1;
  XML_Char *result;
  double *pvalue_local;
  xlsxioreadersheet sheethandle_local;
  
  __nptr = xlsxioread_sheet_next_cell(sheethandle);
  if (__nptr == (XML_Char *)0x0) {
    sheethandle_local._4_4_ = 0;
  }
  else {
    if (pvalue != (double *)0x0) {
      dVar1 = strtod(__nptr,(char **)0x0);
      *pvalue = dVar1;
    }
    free(__nptr);
    sheethandle_local._4_4_ = 1;
  }
  return sheethandle_local._4_4_;
}

Assistant:

DLL_EXPORT_XLSXIO int xlsxioread_sheet_next_cell_float (xlsxioreadersheet sheethandle, double* pvalue)
{
  XML_Char* result;
  if ((result = xlsxioread_sheet_next_cell(sheethandle)) == NULL)
    return 0;
  if (pvalue)
    *pvalue = XML_Char_tod(result);
  free(result);
  return 1;
}